

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

int Clasp::xconvert(char *x,SatPreParams *out,char **err,int e)

{
  int iVar1;
  KV *pKVar2;
  undefined8 *in_RDX;
  SatPreParams *in_RSI;
  char **in_RDI;
  Span<Potassco::KV> SVar3;
  KV *val;
  char *it;
  uint32 id;
  Span<Potassco::KV> map;
  KV kv [5];
  char *next;
  uint32 len;
  uint32 n;
  int in_stack_ffffffffffffff3c;
  char **in_stack_ffffffffffffff40;
  OffType *in_stack_ffffffffffffff48;
  char **errPos;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar4;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_80;
  uint local_70;
  uint local_60;
  uint local_50;
  char **local_40;
  int local_34;
  uint local_30;
  SatPreParams local_2c;
  undefined8 *local_20;
  SatPreParams *local_18;
  char **local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = Potassco::xconvert((char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                             in_stack_ffffffffffffff3c);
  if (iVar1 == 0) {
    local_34 = 0;
    iVar1 = Potassco::xconvert(in_stack_ffffffffffffff58,
                               (uint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                               ,(char **)in_stack_ffffffffffffff48,
                               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    if ((iVar1 != 0) &&
       (*local_18 = (SatPreParams)((ulong)*local_18 & 0xfffffffffffffffc | (ulong)local_30 & 3),
       (uint)((ulong)local_30 & 3) == local_30)) {
      local_10 = local_40;
      local_34 = 1;
      memcpy(&stack0xffffffffffffff68,&PTR_anon_var_dwarf_3379a_002dce50,0x50);
      SVar3 = Potassco::toSpan<Potassco::KV>((KV *)&stack0xffffffffffffff68,5);
      uVar4 = 0;
      while (*(char *)local_10 == ',') {
        errPos = local_10;
        pKVar2 = Potassco::findValue((Span<Potassco::KV> *)
                                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                     in_stack_ffffffffffffff68,(char **)SVar3.size,
                                     (char *)SVar3.first);
        if (pKVar2 != (KV *)0x0) {
          uVar4 = (uint)((long)pKVar2 - (long)&stack0xffffffffffffff68 >> 4);
          errPos = local_40;
        }
        if ((4 < uVar4) ||
           (iVar1 = Potassco::xconvert((char *)SVar3.first,
                                       (int *)CONCAT44(uVar4,in_stack_ffffffffffffff50),errPos,
                                       (int)((ulong)pKVar2 >> 0x20)), iVar1 == 0)) break;
        uVar4 = uVar4 + 1;
        local_34 = local_34 + 1;
        local_10 = local_40;
      }
      *local_18 = (SatPreParams)
                  ((ulong)*local_18 & 0xffffffffffffe003 |
                  ((ulong)in_stack_ffffffffffffff70 & 0x7ff) << 2);
      if ((uint)((ulong)in_stack_ffffffffffffff70 & 0x7ff) != in_stack_ffffffffffffff70) {
        *local_18 = (SatPreParams)((ulong)*local_18 & 0xffffffffffffe003);
      }
      *local_18 = (SatPreParams)
                  ((ulong)*local_18 & 0xffffffffffff | ((ulong)local_80 & 0xffff) << 0x30);
      if ((uint)((ulong)local_80 & 0xffff) != local_80) {
        *local_18 = (SatPreParams)((ulong)*local_18 & 0xffffffffffff);
      }
      *local_18 = (SatPreParams)
                  ((ulong)*local_18 & 0xfffffffffe001fff | ((ulong)local_70 & 0xfff) << 0xd);
      if ((uint)((ulong)local_70 & 0xfff) != local_70) {
        *local_18 = (SatPreParams)((ulong)*local_18 & 0xfffffffffe001fff);
      }
      *local_18 = (SatPreParams)
                  ((ulong)*local_18 & 0xffffffff01ffffff | ((ulong)local_60 & 0x7f) << 0x19);
      if ((uint)((ulong)local_60 & 0x7f) != local_60) {
        *local_18 = (SatPreParams)((ulong)*local_18 & 0xffffffff01ffffff);
      }
      *local_18 = (SatPreParams)
                  ((ulong)*local_18 & 0xffff0000ffffffff | (ulong)(local_50 & 0xffff) << 0x20);
      if ((local_50 & 0xffff) != local_50) {
        *local_18 = (SatPreParams)((ulong)*local_18 & 0xffff0000ffffffff);
      }
    }
    if (local_20 != (undefined8 *)0x0) {
      *local_20 = local_10;
    }
    local_4 = local_34;
  }
  else {
    SatPreParams::SatPreParams(&local_2c);
    *local_18 = local_2c;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int xconvert(const char* x, SatPreParams& out, const char** err, int e) {
	using Potassco::xconvert;
	if (xconvert(x, Potassco::off, err, e)) {
		out = SatPreParams();
		return 1;
	}
	uint32 n, len = 0;
	const char *next;
	if (xconvert(x, n, &next, e) && SET(out.type, n)) {
		x = next; ++len;
		Potassco::KV kv[5] = {{"iter", 0}, {"occ", 0}, {"time", 0}, {"frozen", 0}, {"size", 4000}};
		Potassco::Span<Potassco::KV> map = Potassco::toSpan(kv, 5);
		for (uint32 id = 0; *x == ','; ++id, ++len) {
			const char* it = x;
			if (const Potassco::KV* val = Potassco::findValue(map, it + 1, &next, ":=")) {
				id = static_cast<uint32>(val - kv);
				it = next;
			}
			if (id > 4 || !xconvert(it + 1, kv[id].value, &next, e)) { break; }
			x = next;
		}
		SET_OR_ZERO(out.limIters,  unsigned(kv[0].value));
		SET_OR_ZERO(out.limOcc,    unsigned(kv[1].value));
		SET_OR_ZERO(out.limTime,   unsigned(kv[2].value));
		SET_OR_ZERO(out.limFrozen, unsigned(kv[3].value));
		SET_OR_ZERO(out.limClause, unsigned(kv[4].value));
	}
	if (err) { *err = x; }
	return static_cast<int>(len);
}